

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

bool __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::verifyRecursive
          (BinaryAtomicIntermValuesInstance *this,deInt32 index,deInt32 valueSoFar,bool *argsUsed,
          deInt32 *atomicArgs,deInt32 *resultValues)

{
  bool bVar1;
  deInt32 valueSoFar_00;
  deInt32 i;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  if (index < 5) {
    for (lVar2 = 0; bVar3 = lVar2 != 5, bVar3; lVar2 = lVar2 + 1) {
      if ((argsUsed[lVar2] == false) && (resultValues[lVar2] == valueSoFar)) {
        argsUsed[lVar2] = true;
        valueSoFar_00 =
             computeBinaryAtomicOperationResult
                       ((this->super_BinaryAtomicInstanceBase).m_operation,valueSoFar,
                        atomicArgs[lVar2]);
        bVar1 = verifyRecursive(this,index + 1,valueSoFar_00,argsUsed,atomicArgs,resultValues);
        if (bVar1) {
          return bVar3;
        }
        argsUsed[lVar2] = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool BinaryAtomicIntermValuesInstance::verifyRecursive (const deInt32	index,
														const deInt32	valueSoFar,
														bool			argsUsed[NUM_INVOCATIONS_PER_PIXEL],
														const deInt32	atomicArgs[NUM_INVOCATIONS_PER_PIXEL],
														const deInt32	resultValues[NUM_INVOCATIONS_PER_PIXEL]) const
{
	if (index >= static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL))
		return true;

	for (deInt32 i = 0; i < static_cast<deInt32>(NUM_INVOCATIONS_PER_PIXEL); i++)
	{
		if (!argsUsed[i] && resultValues[i] == valueSoFar)
		{
			argsUsed[i] = true;

			if (verifyRecursive(index + 1, computeBinaryAtomicOperationResult(m_operation, valueSoFar, atomicArgs[i]), argsUsed, atomicArgs, resultValues))
			{
				return true;
			}

			argsUsed[i] = false;
		}
	}

	return false;
}